

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  vector_t ***out;
  vector_t ****out_00;
  int iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  float32 ***new_mixw;
  int iVar7;
  uint n_inc;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  uint32 *veclen;
  uint32 n_mixw;
  vector_t ***local_80;
  vector_t ****local_78;
  uint32 n_dnom;
  vector_t ***local_68;
  vector_t ****fullvar;
  vector_t ***var;
  float32 ***local_50;
  float32 ***mixw;
  float32 ***dnom;
  vector_t ***mean;
  
  var = (vector_t ***)0x0;
  fullvar = (vector_t ****)0x0;
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-inmixwfn");
  iVar7 = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
          ,0x56,"Reading mixing weight file %s.\n",pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-inmixwfn");
  iVar1 = s3mixw_read(pcVar4,&mixw,&n_mixw,&n_feat,&n_density);
  if (iVar1 == 0) {
    pcVar3 = cmd_ln_get();
    uVar5 = cmd_ln_int_r(pcVar3,"-ninc");
    n_inc = (uint)uVar5;
    if (n_density < (uint)uVar5) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
              ,100,
              "# of densities to split (== %u) > total # of densities/mixture (== %u); # split <- %u # den/mix\n"
              ,uVar5 & 0xffffffff,(ulong)n_density,(ulong)n_density);
      n_inc = n_density;
    }
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-inmeanfn");
    iVar1 = s3gau_read(pcVar4,&mean,&n_mgau,&n_feat,&n_density,&veclen);
    if (iVar1 == 0) {
      pcVar3 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar3,"-fullvar");
      pcVar3 = cmd_ln_get();
      pcVar4 = cmd_ln_str_r(pcVar3,"-invarfn");
      iVar1 = (int)lVar6;
      if (iVar1 == 0) {
        iVar2 = s3gau_read(pcVar4,&var,&n_mgau,&n_feat,&n_density,&veclen);
      }
      else {
        iVar2 = s3gau_read_full(pcVar4,&fullvar,&n_mgau,&n_feat,&n_density,&veclen);
      }
      if (iVar2 == 0) {
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-dcountfn");
        iVar2 = s3gaudnom_read(pcVar4,&dnom,&n_dnom,&n_feat,&n_density);
        if (iVar2 == 0) {
          local_68 = gauden_alloc_param(n_mgau,n_feat,n_density + n_inc,veclen);
          if (iVar1 == 0) {
            local_80 = gauden_alloc_param(n_mgau,n_feat,n_density + n_inc,veclen);
            local_78 = (vector_t ****)0x0;
          }
          else {
            local_78 = gauden_alloc_param_full(n_mgau,n_feat,n_density + n_inc,veclen);
            local_80 = (vector_t ***)0x0;
          }
          new_mixw = (float32 ***)
                     __ckd_calloc_3d__((ulong)n_mixw,(ulong)n_feat,(ulong)(n_density + n_inc),4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                                       ,0x95);
          iVar7 = 1;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                  ,0x97,"output n_density == %u\n",(ulong)(n_density + n_inc));
          local_50 = new_mixw;
          inc_densities(new_mixw,local_68,local_80,local_78,mixw,mean,var,fullvar,dnom,n_mixw,n_mgau
                        ,n_dnom,n_feat,n_density,veclen,n_inc);
          pcVar3 = cmd_ln_get();
          pcVar4 = cmd_ln_str_r(pcVar3,"-outmixwfn");
          if (pcVar4 == (char *)0x0) {
            pcVar4 = "You must use the -outmixwfn argument\n";
            lVar6 = 0xb7;
LAB_0010333a:
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/inc_comp/main.c"
                    ,lVar6,pcVar4);
            exit(1);
          }
          pcVar3 = cmd_ln_get();
          pcVar4 = cmd_ln_str_r(pcVar3,"-outmixwfn");
          iVar2 = s3mixw_write(pcVar4,local_50,n_mixw,n_feat,n_density + n_inc);
          if (iVar2 == 0) {
            pcVar3 = cmd_ln_get();
            pcVar4 = cmd_ln_str_r(pcVar3,"-outmeanfn");
            if (pcVar4 == (char *)0x0) {
              pcVar4 = "You must use the -outmeanfn argument\n";
              lVar6 = 0xc5;
              goto LAB_0010333a;
            }
            pcVar3 = cmd_ln_get();
            pcVar4 = cmd_ln_str_r(pcVar3,"-outmeanfn");
            iVar2 = s3gau_write(pcVar4,local_68,n_mgau,n_feat,n_density + n_inc,veclen);
            out_00 = local_78;
            out = local_80;
            if (iVar2 == 0) {
              pcVar3 = cmd_ln_get();
              pcVar4 = cmd_ln_str_r(pcVar3,"-outvarfn");
              if (pcVar4 == (char *)0x0) {
                pcVar4 = "You must use the -outvarfn argument\n";
                lVar6 = 0xdf;
                goto LAB_0010333a;
              }
              pcVar3 = cmd_ln_get();
              pcVar4 = cmd_ln_str_r(pcVar3,"-outvarfn");
              if (iVar1 == 0) {
                iVar1 = s3gau_write(pcVar4,out,n_mgau,n_feat,n_inc + n_density,veclen);
              }
              else {
                iVar1 = s3gau_write_full(pcVar4,out_00,n_mgau,n_feat,n_inc + n_density,veclen);
              }
              if (iVar1 == 0) {
                iVar7 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int
main(int argc, char *argv[])
{
    vector_t ***mean;
    vector_t ***var = NULL;
    vector_t ****fullvar = NULL;
    vector_t ***new_mean;
    vector_t ***new_var = NULL;
    vector_t ****new_fullvar = NULL;
    float32  ***dnom;
    float32 ***mixw;
    float32 ***new_mixw;
    uint32 n_mixw;
    uint32 n_mgau;
    uint32 n_dnom;
    uint32 n_feat;
    uint32 n_density;
    uint32 n_inc;
    uint32 *veclen;
    int32 var_is_full;

    parse_cmd_ln(argc, argv);

    E_INFO("Reading mixing weight file %s.\n",
	   cmd_ln_str("-inmixwfn"));

    if (s3mixw_read(cmd_ln_str("-inmixwfn"),
		    &mixw,
		    &n_mixw,
		    &n_feat,
		    &n_density) != S3_SUCCESS) {
	return 1;
    }

    n_inc = cmd_ln_int32("-ninc");

    if (n_inc > n_density) {
	E_WARN("# of densities to split (== %u) > total # of densities/mixture (== %u); # split <- %u # den/mix\n",
	       n_inc, n_density, n_density);
	n_inc = n_density;
    }
    
    if (s3gau_read(cmd_ln_str("-inmeanfn"),
		   &mean,
		   &n_mgau,
		   &n_feat,
		   &n_density,
		   &veclen) != S3_SUCCESS) {
	return 1;
    }

    var_is_full = cmd_ln_int32("-fullvar");
    if (var_is_full) {
	if (s3gau_read_full(cmd_ln_str("-invarfn"),
			    &fullvar,
			    &n_mgau,
			    &n_feat,
			    &n_density,
			    &veclen) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	if (s3gau_read(cmd_ln_str("-invarfn"),
		       &var,
		       &n_mgau,
		       &n_feat,
		       &n_density,
		       &veclen) != S3_SUCCESS) {
	    return 1;
	}
    }

    if (s3gaudnom_read(cmd_ln_str("-dcountfn"),
		       &dnom,
		       &n_dnom,
		       &n_feat,
		       &n_density) != S3_SUCCESS) {
	return 1;
    }
	
    new_mean = gauden_alloc_param(n_mgau, n_feat, n_density+n_inc, veclen);
    if (var_is_full)
	    new_fullvar  = gauden_alloc_param_full(n_mgau, n_feat, n_density+n_inc, veclen);
    else
	    new_var  = gauden_alloc_param(n_mgau, n_feat, n_density+n_inc, veclen);
    new_mixw = (float32 ***)ckd_calloc_3d(n_mixw, n_feat, n_density+n_inc,
					  sizeof(float32));
    
    E_INFO("output n_density == %u\n", n_density+n_inc);

    inc_densities(new_mixw,
		  new_mean,
		  new_var,
		  new_fullvar,

		  mixw,
		  mean,
		  var,
		  fullvar,
		  dnom,

		  n_mixw,
		  n_mgau,
		  n_dnom,
		  n_feat,
		  n_density,
		  veclen,

		  n_inc);

    if (cmd_ln_str("-outmixwfn") != NULL) {
	if (s3mixw_write(cmd_ln_str("-outmixwfn"),
			 new_mixw,
			 n_mixw,
			 n_feat,
			 n_density+n_inc) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	E_FATAL("You must use the -outmixwfn argument\n");
    }

    if (cmd_ln_str("-outmeanfn") != NULL) {
	if (s3gau_write(cmd_ln_str("-outmeanfn"),
			(const vector_t ***)new_mean,
			n_mgau,
			n_feat,
			n_density+n_inc,
			veclen) != S3_SUCCESS) {
	    return 1;
	}
    }
    else {
	E_FATAL("You must use the -outmeanfn argument\n");
    }

    if (cmd_ln_str("-outvarfn") != NULL) {
	if (var_is_full) {
	    if (s3gau_write_full(cmd_ln_str("-outvarfn"),
				 (const vector_t ****)new_fullvar,
				 n_mgau,
				 n_feat,
				 n_density+n_inc,
				 veclen) != S3_SUCCESS) {
		return 1;
	    }
	}
	else {
	    if (s3gau_write(cmd_ln_str("-outvarfn"),
			    (const vector_t ***)new_var,
			    n_mgau,
			    n_feat,
			    n_density+n_inc,
			    veclen) != S3_SUCCESS) {
		return 1;
	    }
	}
    }
    else {
	E_FATAL("You must use the -outvarfn argument\n");
    }

    return 0;
}